

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O1

void ImGui_ImplSDL2_UpdateGamepadButton
               (ImGui_ImplSDL2_Data *bd,ImGuiIO *io,ImGuiKey key,SDL_GameControllerButton button_no)

{
  _SDL_GameController **pp_Var1;
  char cVar2;
  long lVar3;
  bool down;
  long lVar4;
  
  lVar4 = (long)(bd->Gamepads).Size;
  if (lVar4 == 0) {
    down = false;
  }
  else {
    pp_Var1 = (bd->Gamepads).Data;
    lVar3 = 0;
    down = false;
    do {
      cVar2 = SDL_GameControllerGetButton(*(undefined8 *)((long)pp_Var1 + lVar3),button_no);
      down = (bool)(down | cVar2 != '\0');
      lVar3 = lVar3 + 8;
    } while (lVar4 * 8 != lVar3);
  }
  ImGuiIO::AddKeyEvent(io,key,down);
  return;
}

Assistant:

static void ImGui_ImplSDL2_UpdateGamepadButton(ImGui_ImplSDL2_Data* bd, ImGuiIO& io, ImGuiKey key, SDL_GameControllerButton button_no)
{
    bool merged_value = false;
    for (SDL_GameController* gamepad : bd->Gamepads)
        merged_value |= SDL_GameControllerGetButton(gamepad, button_no) != 0;
    io.AddKeyEvent(key, merged_value);
}